

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

void __thiscall Fl_Help_View::add_link(Fl_Help_View *this,char *n,int xx,int yy,int ww,int hh)

{
  Fl_Help_Link *pFVar1;
  char *pcVar2;
  char *target;
  Fl_Help_Link *temp;
  int hh_local;
  int ww_local;
  int yy_local;
  int xx_local;
  char *n_local;
  Fl_Help_View *this_local;
  
  if (this->alinks_ <= this->nlinks_) {
    this->alinks_ = this->alinks_ + 0x10;
    if (this->alinks_ == 0x10) {
      pFVar1 = (Fl_Help_Link *)malloc((long)this->alinks_ * 0xf0);
      this->links_ = pFVar1;
    }
    else {
      pFVar1 = (Fl_Help_Link *)realloc(this->links_,(long)this->alinks_ * 0xf0);
      this->links_ = pFVar1;
    }
  }
  pFVar1 = this->links_ + this->nlinks_;
  pFVar1->x = xx;
  pFVar1->y = yy;
  pFVar1->w = xx + ww;
  pFVar1->h = yy + hh;
  fl_strlcpy(pFVar1->filename,n,0xc0);
  pcVar2 = strrchr(pFVar1->filename,0x23);
  if (pcVar2 == (char *)0x0) {
    pFVar1->name[0] = '\0';
  }
  else {
    *pcVar2 = '\0';
    fl_strlcpy(pFVar1->name,pcVar2 + 1,0x20);
  }
  this->nlinks_ = this->nlinks_ + 1;
  return;
}

Assistant:

void Fl_Help_View::add_link(const char *n,	// I - Name of link
                      int        xx,	// I - X position of link
		      int        yy,	// I - Y position of link
		      int        ww,	// I - Width of link text
		      int        hh)	// I - Height of link text
{
  Fl_Help_Link	*temp;			// New link
  char		*target;		// Pointer to target name


  if (nlinks_ >= alinks_)
  {
    alinks_ += 16;

    if (alinks_ == 16)
      links_ = (Fl_Help_Link *)malloc(sizeof(Fl_Help_Link) * alinks_);
    else
      links_ = (Fl_Help_Link *)realloc(links_, sizeof(Fl_Help_Link) * alinks_);
  }

  temp = links_ + nlinks_;

  temp->x       = xx;
  temp->y       = yy;
  temp->w       = xx + ww;
  temp->h       = yy + hh;

  strlcpy(temp->filename, n, sizeof(temp->filename));

  if ((target = strrchr(temp->filename, '#')) != NULL)
  {
    *target++ = '\0';
    strlcpy(temp->name, target, sizeof(temp->name));
  }
  else
    temp->name[0] = '\0';

  nlinks_ ++;
}